

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void __thiscall duckdb_parquet::FileCryptoMetaData::FileCryptoMetaData(FileCryptoMetaData *this)

{
  *(undefined ***)this = &PTR__FileCryptoMetaData_024c0c80;
  EncryptionAlgorithm::EncryptionAlgorithm(&this->encryption_algorithm);
  (this->key_metadata)._M_dataplus._M_p = (pointer)&(this->key_metadata).field_2;
  (this->key_metadata)._M_string_length = 0;
  (this->key_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_FileCryptoMetaData__isset)((byte)this->__isset & 0xfe);
  return;
}

Assistant:

FileCryptoMetaData::FileCryptoMetaData() noexcept
   : key_metadata() {
}